

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O0

void __thiscall
google::protobuf::internal::ThreadSafeArena::ThreadSafeArena
          (ThreadSafeArena *this,char *mem,size_t size)

{
  ArenaBlock *pAVar1;
  size_t size_local;
  char *mem_local;
  ThreadSafeArena *this_local;
  
  this->tag_and_id_ = 0;
  TaggedAllocationPolicyPtr::TaggedAllocationPolicyPtr(&this->alloc_policy_);
  absl::lts_20250127::Mutex::Mutex(&this->mutex_);
  std::atomic<google::protobuf::internal::ThreadSafeArena::SerialArenaChunk_*>::atomic
            (&this->head_,(__pointer_type)0x0);
  pAVar1 = FirstBlock(this,mem,size);
  SerialArena::SerialArena(&this->first_arena_,pAVar1,this);
  Init(this);
  return;
}

Assistant:

ThreadSafeArena::ThreadSafeArena(char* mem, size_t size)
    : first_arena_(FirstSerialArena{}, FirstBlock(mem, size), *this) {
  Init();
}